

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::MthdCelsiusDepthRangeNear::emulate_mthd(MthdCelsiusDepthRangeNear *this)

{
  pgraph_state *state;
  uint32_t val;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c & 0x100) !=
      0) {
    MthdTest::warn((MthdTest *)this,4);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    val = (this->super_SingleMthdTest).super_MthdTest.val;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_depth_range_near = val;
    pgraph_celsius_icmd(state,0x26,val,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				exp.bundle_depth_range_near = val;
				pgraph_celsius_icmd(&exp, 0x26, exp.bundle_depth_range_near, true);
			}
		}
	}